

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

reference __thiscall
duckdb::vector<std::pair<unsigned_long,_float>,_true>::operator[]
          (vector<std::pair<unsigned_long,_float>,_true> *this,size_type __n)

{
  reference pvVar1;
  size_type in_RDI;
  vector<std::pair<unsigned_long,_float>,_true> *unaff_retaddr;
  
  pvVar1 = get<true>(unaff_retaddr,in_RDI);
  return pvVar1;
}

Assistant:

typename original::reference operator[](typename original::size_type __n) { // NOLINT: hiding on purpose
		return get<SAFE>(__n);
	}